

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void transassn(quadtype nextquad)

{
  char local_1c [8];
  char source [10];
  char target [10];
  
  getlabel(nextquad.opcode,source + 2);
  getlabel(nextquad.op1.opnd,local_1c);
  fprintf((FILE *)ofp,"; ");
  fprintlexeme(ofp,nextquad.opcode);
  fprintf((FILE *)ofp," := ");
  fprintlexeme(ofp,nextquad.op1.opnd);
  fprintf((FILE *)ofp,"\n");
  emitfromone(opcmov,"ax",nextquad.op1.opnd);
  emittoone(opcmov,nextquad.opcode,"ax");
  return;
}

Assistant:

void    transassn(struct quadtype nextquad)
{
    char    target[LABELSIZE], source[LABELSIZE];
    getlabel(nextquad.op1.opnd, target);
    getlabel(nextquad.op2.opnd, source);
    fprintf(ofp, "; ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, " := ");
    fprintlexeme(ofp, nextquad.op2.opnd);
    fprintf(ofp, "\n");
    
    emitfromone(opcmov, "ax", nextquad.op2.opnd);
    emittoone(opcmov, nextquad.op1.opnd, "ax");
    
    
}